

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O2

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,FunctionCallNode *node)

{
  unsigned_long __val;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  optional<TypeName> *poVar2;
  mapped_type *pmVar3;
  TypeName *__k;
  _Self __tmp;
  _List_node_base *p_Var4;
  long *plVar5;
  optional<std::reference_wrapper<Symbol>_> oVar6;
  TypeChecker typeChecker;
  string name;
  list<TypeName,_std::allocator<TypeName>_> expectedArgs;
  FunctionAnalyser analyser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  FunctionCallNode *local_168;
  SemanticAnalyser *local_160;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  string local_138;
  _List_base<TypeName,_std::allocator<TypeName>_> local_118;
  undefined1 local_100 [24];
  list<TypeName,_std::allocator<TypeName>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_138,(string *)&node->name_);
  local_160 = this;
  oVar6 = SymbolTable::lookup(&this->symbols_,&local_138,0);
  if (((undefined1  [16])
       oVar6.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    std::operator+(&bStack_1a8,"Calling undefined function named ",&local_138);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   &bStack_1a8,"!");
    reportError((string *)local_100,(Node *)node);
  }
  FunctionAnalyser::FunctionAnalyser((FunctionAnalyser *)local_100);
  (**(code **)(*(long *)oVar6.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>.
                        _M_payload.super__Optional_payload_base<std::reference_wrapper<Symbol>_>.
                        _M_payload + 0x10))
            (oVar6.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload,local_100);
  if (local_100[8] != false) {
    if ((local_100[0x10] & 1) != 0) {
      std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::list
                ((list<TypeName,_std::allocator<TypeName>_> *)&local_118,&local_e8);
      iVar1 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
      __val = *(unsigned_long *)(CONCAT44(extraout_var,iVar1) + 0x10);
      if (local_118._M_impl._M_node._M_size != __val) {
        std::operator+(&local_d0,"Function ",&local_138);
        std::operator+(&local_b0,&local_d0," expected ");
        std::__cxx11::to_string((string *)local_158,local_118._M_impl._M_node._M_size);
        std::operator+(&local_90,&local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158);
        std::operator+(&local_70,&local_90,", but got ");
        std::__cxx11::to_string(&local_50,__val);
        std::operator+(&local_188,&local_70,&local_50);
        std::operator+(&bStack_1a8,&local_188," arguments!");
        reportError(&bStack_1a8,(Node *)node);
      }
      local_168 = node;
      iVar1 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
      p_Var4 = local_118._M_impl._M_node.super__List_node_base._M_next;
      plVar5 = (long *)CONCAT44(extraout_var_00,iVar1);
      while (plVar5 = (long *)*plVar5, plVar5 != (long *)CONCAT44(extraout_var_00,iVar1)) {
        (**(code **)(*(long *)plVar5[2] + 0x10))((long *)plVar5[2],local_160);
        local_158._0_8_ = &PTR__Visitor_001d0488;
        local_158[0xc] = false;
        local_148._M_allocated_capacity = (size_type)&this->symbols_;
        (**(code **)(*(long *)plVar5[2] + 0x10))((long *)plVar5[2],(TypeChecker *)local_158);
        poVar2 = TypeChecker::getType((TypeChecker *)local_158);
        if ((poVar2->super__Optional_base<TypeName,_true,_true>)._M_payload.
            super__Optional_payload_base<TypeName>._M_engaged == true) {
          poVar2 = TypeChecker::getType((TypeChecker *)local_158);
          if (((poVar2->super__Optional_base<TypeName,_true,_true>)._M_payload.
               super__Optional_payload_base<TypeName>._M_engaged != true) ||
             ((poVar2->super__Optional_base<TypeName,_true,_true>)._M_payload.
              super__Optional_payload_base<TypeName>._M_payload._M_value !=
              *(TypeName *)&p_Var4[1]._M_next)) {
            std::operator+(&local_d0,"Function ",&local_138);
            std::operator+(&local_b0,&local_d0," expected argument of type ");
            pmVar3 = std::__detail::
                     _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&TypeNameStrings_abi_cxx11_,(key_type *)(p_Var4 + 1));
            std::operator+(&local_90,&local_b0,pmVar3);
            std::operator+(&local_70,&local_90,", but got ");
            poVar2 = TypeChecker::getType((TypeChecker *)local_158);
            __k = std::optional<TypeName>::value(poVar2);
            pmVar3 = std::__detail::
                     _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&TypeNameStrings_abi_cxx11_,__k);
            std::operator+(&local_188,&local_70,pmVar3);
            std::operator+(&bStack_1a8,&local_188,"!");
            reportError(&bStack_1a8,(Node *)local_168);
          }
        }
        p_Var4 = p_Var4->_M_next;
      }
      std::__cxx11::_List_base<TypeName,_std::allocator<TypeName>_>::_M_clear(&local_118);
    }
    FunctionAnalyser::~FunctionAnalyser((FunctionAnalyser *)local_100);
    std::__cxx11::string::~string((string *)&local_138);
    return;
  }
  std::operator+(&local_188,"Symbol ",&local_138);
  std::operator+(&bStack_1a8,&local_188," does not name a function!");
  reportError(&bStack_1a8,(Node *)node);
}

Assistant:

void SemanticAnalyser::visit(const FunctionCallNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name);
  if(!symbol)
    reportError("Calling undefined function named " + name + "!", node);

  FunctionAnalyser analyser{};
  symbol.value().get().accept(analyser);
  if(!analyser.isSymbolValid())
    reportError("Symbol " + name + " does not name a function!", node);

  /*
   * If user calls variable of type function, then analyser knows nothing about it's return type and arguments.
   * This is because variables' values are not being tracked.
   */
  if(analyser.getReturnType().has_value())
  {
    const auto expectedArgs = analyser.getArguments();
    const auto& providedArgs = node.getArguments();
    const auto nExpectedArgs = expectedArgs.size();
    const auto nProvidedArgs = providedArgs.size();

    if(nExpectedArgs != nProvidedArgs)
      reportError("Function " + name + " expected " +
        std::to_string(nExpectedArgs) + ", but got " + std::to_string(nProvidedArgs) + " arguments!", node);

    auto expectedArgsIt = expectedArgs.begin();
    for(const auto& arg : node.getArguments())
    {
      arg->accept(*this);

      TypeChecker typeChecker{symbols_};
      arg->accept(typeChecker);
      if(typeChecker.getType().has_value() && typeChecker.getType() != *expectedArgsIt)
        reportError("Function " + name + " expected argument of type " + 
          TypeNameStrings.at(*expectedArgsIt) + ", but got " + 
            TypeNameStrings.at(typeChecker.getType().value()) + "!", node);
      
      expectedArgsIt++;
    }
  }
}